

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void refine_winner_mode_tx
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx,THR_MODES *best_mode_index,MB_MODE_INFO *best_mbmode,
               buf_2d (*yv12_mb) [3],int best_rate_y,int best_rate_uv,int *best_skip2,
               int winner_mode_count)

{
  MB_MODE_INFO *mbmi_00;
  undefined8 uVar1;
  macroblockd_plane *pmVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  AV1_COMMON *cm_00;
  MACROBLOCKD *xd_00;
  AV1_COMMON *pAVar7;
  undefined1 in_CL;
  long lVar8;
  undefined8 *puVar9;
  RD_STATS *in_RDX;
  MACROBLOCK *in_RSI;
  long in_RDI;
  long in_R8;
  THR_MODES *in_R9;
  uint uVar10;
  MB_MODE_INFO *in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 *in_stack_00000028;
  int in_stack_00000030;
  int64_t this_rd;
  int this_rate;
  ModeCosts *mode_costs;
  int i_1;
  PREDICTION_MODE prediction_mode;
  _Bool is_predictor_built;
  int mi_col;
  int mi_row;
  int i;
  int skip_ctx;
  RD_STATS rd_stats_uv;
  RD_STATS rd_stats_y;
  int skip_blk;
  RD_STATS rd_stats;
  MB_MODE_INFO *winner_mbmi;
  THR_MODES winner_mode_index;
  int winner_rate_uv;
  int winner_rate_y;
  RD_STATS *winner_rd_stats;
  int mode_idx;
  int num_planes;
  int64_t best_rd;
  TxfmSearchInfo *txfm_info;
  TxfmSearchParams *txfm_params;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  undefined8 in_stack_fffffffffffffe60;
  int *winner_rate_y_00;
  MB_MODE_INFO *in_stack_fffffffffffffe68;
  MB_MODE_INFO *mbmi_01;
  MACROBLOCK *in_stack_fffffffffffffe70;
  MACROBLOCK *x_00;
  undefined2 uVar11;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe84;
  MACROBLOCK *in_stack_fffffffffffffe88;
  AV1_COMP *in_stack_fffffffffffffe90;
  AV1_COMMON *pAVar12;
  BUFFER_SET *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int iVar13;
  undefined4 in_stack_fffffffffffffeac;
  AV1_COMMON *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  BLOCK_SIZE bs;
  RD_STATS *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffecc;
  PREDICTION_MODE in_stack_fffffffffffffece;
  byte in_stack_fffffffffffffecf;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int local_128;
  int local_120;
  MACROBLOCKD *local_118;
  MACROBLOCKD *in_stack_fffffffffffffef8;
  AV1_COMMON *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  MACROBLOCK *in_stack_ffffffffffffff10;
  RD_STATS *in_stack_ffffffffffffff18;
  MACROBLOCK *in_stack_ffffffffffffff20;
  byte in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff29;
  undefined4 local_cc;
  int local_c8 [10];
  MB_MODE_INFO *local_a0;
  undefined1 local_91 [5];
  int local_8c;
  RD_STATS *local_88;
  int local_80;
  MACROBLOCK *x_01;
  AV1_COMP *cpi_00;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  xd_00 = &in_RSI->e_mbd;
  mbmi_00 = *(in_RSI->e_mbd).mi;
  cpi_00 = (AV1_COMP *)&in_RSI->txfm_search_params;
  x_01 = (MACROBLOCK *)&in_RSI->txfm_search_info;
  iVar3 = av1_num_planes(cm_00);
  iVar4 = is_winner_mode_processing_enabled
                    ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,iVar4);
  if ((iVar4 != 0) &&
     (set_mode_eval_params
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (MODE_EVAL_TYPE)((uint)in_stack_fffffffffffffe84 >> 0x18)), *in_R9 != 0xff)) {
    pAVar7 = (AV1_COMMON *)
             (((long)in_RDX->rate * (long)in_RSI->rdmult + 0x100 >> 9) + in_RDX->dist * 0x80);
    for (local_80 = 0; local_80 < in_stack_00000030; local_80 = local_80 + 1) {
      local_88 = (RD_STATS *)0x0;
      local_8c = 0;
      local_91._1_4_ = 0;
      local_91[0] = '\0';
      winner_rate_y_00 = &local_8c;
      mbmi_01 = (MB_MODE_INFO *)(local_91 + 1);
      x_00 = (MACROBLOCK *)local_91;
      uVar10 = (uint)*(byte *)(in_RDI + 0x60c40);
      iVar4 = local_80;
      local_a0 = get_winner_mode_stats
                           (in_RSI,in_stack_00000008,in_RDX,in_stack_00000018,in_stack_00000020,
                            in_R9,&local_88,winner_rate_y_00,(int *)mbmi_01,(THR_MODES *)x_00,
                            *(byte *)(in_RDI + 0x60c40),local_80);
      if (((in_RSI->e_mbd).lossless[(byte)*(undefined2 *)&local_a0->field_0xa7 & 7] == 0) &&
         (local_91[0] != 0xff)) {
        iVar5 = is_winner_mode_processing_enabled
                          ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe7c,uVar10),x_00,mbmi_01,
                           (int)((ulong)winner_rate_y_00 >> 0x20));
        uVar11 = (undefined2)((ulong)x_00 >> 0x30);
        if (iVar5 != 0) {
          memcpy(local_c8,local_88,0x28);
          iVar5 = av1_get_skip_txfm_context(xd_00);
          memcpy(mbmi_00,local_a0,0xb0);
          set_ref_ptrs((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe84,iVar4),
                       (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe7c,uVar10),
                       (MV_REFERENCE_FRAME)((ushort)uVar11 >> 8),(MV_REFERENCE_FRAME)uVar11);
          for (local_128 = 0; bs = (BLOCK_SIZE)((uint)in_stack_fffffffffffffebc >> 0x18),
              local_128 < iVar3; local_128 = local_128 + 1) {
            lVar8 = (long)local_128;
            puVar9 = (undefined8 *)
                     (in_stack_00000010 + (long)mbmi_00->ref_frame[0] * 0x60 +
                     (long)local_128 * 0x20);
            (in_RSI->e_mbd).plane[lVar8].pre[0].buf = (uint8_t *)*puVar9;
            (in_RSI->e_mbd).plane[lVar8].pre[0].buf0 = (uint8_t *)puVar9[1];
            uVar1 = puVar9[2];
            pmVar2 = (in_RSI->e_mbd).plane + lVar8;
            pmVar2->pre[0].width = (int)uVar1;
            pmVar2->pre[0].height = (int)((ulong)uVar1 >> 0x20);
            *(undefined8 *)&(in_RSI->e_mbd).plane[lVar8].pre[0].stride = puVar9[3];
            iVar4 = has_second_ref(mbmi_00);
            if (iVar4 != 0) {
              lVar8 = (long)local_128;
              puVar9 = (undefined8 *)
                       (in_stack_00000010 + (long)mbmi_00->ref_frame[1] * 0x60 +
                       (long)local_128 * 0x20);
              (in_RSI->e_mbd).plane[lVar8].pre[1].buf = (uint8_t *)*puVar9;
              (in_RSI->e_mbd).plane[lVar8].pre[1].buf0 = (uint8_t *)puVar9[1];
              uVar1 = puVar9[2];
              pmVar2 = (in_RSI->e_mbd).plane + lVar8;
              pmVar2->pre[1].width = (int)uVar1;
              pmVar2->pre[1].height = (int)((ulong)uVar1 >> 0x20);
              *(undefined8 *)&(in_RSI->e_mbd).plane[lVar8].pre[1].stride = puVar9[3];
            }
          }
          iVar4 = is_inter_mode(mbmi_00->mode);
          if (iVar4 == 0) {
            av1_pick_uniform_tx_size_type_yrd
                      ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (MACROBLOCK *)
                       CONCAT17(in_stack_fffffffffffffecf,
                                CONCAT16(in_stack_fffffffffffffece,
                                         CONCAT24(in_stack_fffffffffffffecc,
                                                  in_stack_fffffffffffffec8))),
                       in_stack_fffffffffffffec0,bs,(int64_t)in_stack_fffffffffffffeb0);
          }
          else {
            iVar4 = xd_00->mi_row;
            iVar13 = (in_RSI->e_mbd).mi_col;
            in_stack_fffffffffffffecf = 0;
            in_stack_fffffffffffffece = mbmi_00->mode;
            if (((((*(int *)(in_RDI + 0x60c4c) != 0) && (*(char *)(in_RDI + 0x42770) == '\x01')) &&
                 (*(char *)(in_RDI + 0x3bf81) == '\0')) &&
                ((iVar6 = is_inter_mode(in_stack_fffffffffffffece), iVar6 != 0 &&
                 (mbmi_00->motion_mode == '\0')))) &&
               (iVar6 = is_inter_compound_mode(in_stack_fffffffffffffece), iVar6 == 0)) {
              in_stack_fffffffffffffecf =
                   fast_interp_search(cpi_00,x_01,(int)((ulong)pAVar7 >> 0x20),(int)pAVar7,
                                      (BLOCK_SIZE)((uint)iVar3 >> 0x18));
            }
            in_stack_fffffffffffffed0 = iVar13;
            in_stack_fffffffffffffed4 = iVar4;
            if ((in_stack_fffffffffffffecf & 1) == 0) {
              in_stack_fffffffffffffeac = CONCAT13(in_CL,(int3)in_stack_fffffffffffffeac);
              pAVar12 = cm_00;
              in_stack_fffffffffffffe98 = (BUFFER_SET *)xd_00;
              av1_num_planes(cm_00);
              av1_enc_build_inter_predictor
                        (in_stack_fffffffffffffeb0,
                         (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeac,iVar13),iVar4,
                         in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         (BLOCK_SIZE)((ulong)pAVar12 >> 0x38),(int)in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffec8);
              in_stack_fffffffffffffea4 = iVar4;
            }
            if (mbmi_00->motion_mode == '\x01') {
              av1_build_obmc_inter_predictors_sb
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
            }
            av1_subtract_plane((MACROBLOCK *)
                               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                               (BLOCK_SIZE)((ulong)in_stack_fffffffffffffe98 >> 0x38),
                               (int)in_stack_fffffffffffffe98);
            if ((*(TX_MODE *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[1] + 4) ==
                 '\x02') &&
               ((in_RSI->e_mbd).lossless[(byte)*(undefined2 *)&mbmi_00->field_0xa7 & 7] == 0)) {
              av1_pick_recursive_tx_size_type_yrd
                        ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (MACROBLOCK *)
                         CONCAT17(in_stack_fffffffffffffecf,
                                  CONCAT16(in_stack_fffffffffffffece,
                                           CONCAT24(in_stack_fffffffffffffecc,
                                                    in_stack_fffffffffffffec8))),
                         in_stack_fffffffffffffec0,bs,(int64_t)in_stack_fffffffffffffeb0);
            }
            else {
              av1_pick_uniform_tx_size_type_yrd
                        ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (MACROBLOCK *)
                         CONCAT17(in_stack_fffffffffffffecf,
                                  CONCAT16(in_stack_fffffffffffffece,
                                           CONCAT24(in_stack_fffffffffffffecc,
                                                    in_stack_fffffffffffffec8))),
                         in_stack_fffffffffffffec0,bs,(int64_t)in_stack_fffffffffffffeb0);
              memset(mbmi_00->inter_tx_size,(uint)mbmi_00->tx_size,0x10);
              for (in_stack_fffffffffffffec8 = 0;
                  in_stack_fffffffffffffec8 <
                  (int)((uint)(in_RSI->e_mbd).height * (uint)(in_RSI->e_mbd).width);
                  in_stack_fffffffffffffec8 = in_stack_fffffffffffffec8 + 1) {
                set_blk_skip((uint8_t *)((long)&x_01->plane[0].src_diff + 1),0,
                             in_stack_fffffffffffffec8,(uint)in_stack_ffffffffffffff28);
              }
            }
          }
          if (iVar3 < 2) {
            av1_init_rd_stats((RD_STATS *)&local_120);
          }
          else {
            av1_txfm_uvrd((AV1_COMP *)CONCAT71(in_stack_ffffffffffffff29,in_stack_ffffffffffffff28),
                          in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff10 >> 0x38),
                          CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          }
          in_stack_fffffffffffffec0 = (RD_STATS *)&in_RSI->mode_costs;
          iVar4 = is_inter_mode(mbmi_00->mode);
          if ((iVar4 == 0) ||
             (((long)(((int (*) [2])&in_stack_fffffffffffffec0[0x1db].sse)[iVar5][0] +
                      in_stack_ffffffffffffff08 + local_120) * (long)in_RSI->rdmult + 0x100 >> 9) +
              ((long)(local_118->plane[0].pre + 2) +
              (long)(in_stack_ffffffffffffff10->plane + -1) + 8) * 0x80 <=
              ((long)((int (*) [2])&in_stack_fffffffffffffec0[0x1db].sse)[iVar5][1] *
               (long)in_RSI->rdmult + 0x100 >> 9) +
              ((long)(in_stack_fffffffffffffef8->plane[0].pre + 2) +
              (long)(in_stack_ffffffffffffff20->plane + -1) + 8) * 0x80)) {
            local_cc = 0;
            in_stack_ffffffffffffff08 =
                 ((int (*) [2])&in_stack_fffffffffffffec0[0x1db].sse)[iVar5][0] +
                 in_stack_ffffffffffffff08;
          }
          else {
            local_cc = 1;
            in_stack_ffffffffffffff08 =
                 ((int (*) [2])&in_stack_fffffffffffffec0[0x1db].sse)[iVar5][1];
            local_120 = 0;
            local_118 = in_stack_fffffffffffffef8;
            in_stack_ffffffffffffff10 = in_stack_ffffffffffffff20;
          }
          in_stack_fffffffffffffebc =
               ((local_c8[0] + in_stack_ffffffffffffff08 + local_120) - local_8c) - local_91._1_4_;
          in_stack_fffffffffffffeb0 =
               (AV1_COMMON *)
               (((long)in_stack_fffffffffffffebc * (long)in_RSI->rdmult + 0x100 >> 9) +
               ((long)(local_118->plane[0].pre + 2) +
               (long)(in_stack_ffffffffffffff10->plane + -1) + 8) * 0x80);
          if ((long)in_stack_fffffffffffffeb0 < (long)pAVar7) {
            memcpy(in_stack_00000008,mbmi_00,0xb0);
            *in_R9 = local_91[0];
            memcpy(*(void **)(in_R8 + 0x118),(uint8_t *)((long)&x_01->plane[0].src_diff + 1),
                   (long)*(int *)(in_R8 + 0x1a0));
            memcpy(*(void **)(in_R8 + 0x198),(in_RSI->e_mbd).tx_type_map,
                   (long)*(int *)(in_R8 + 0x1a0));
            in_RDX->rate = in_stack_fffffffffffffebc;
            in_RDX->dist = (long)(local_118->plane[0].pre + 2) +
                           (long)(in_stack_ffffffffffffff10->plane + -1) + 8;
            in_RDX->sse = (long)(in_stack_fffffffffffffef8->plane[0].pre + 2) +
                          (long)(in_stack_ffffffffffffff20->plane + -1) + 8;
            in_RDX->rdcost = (int64_t)in_stack_fffffffffffffeb0;
            *in_stack_00000028 = local_cc;
            pAVar7 = in_stack_fffffffffffffeb0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void refine_winner_mode_tx(
    const AV1_COMP *cpi, MACROBLOCK *x, RD_STATS *rd_cost, BLOCK_SIZE bsize,
    PICK_MODE_CONTEXT *ctx, THR_MODES *best_mode_index,
    MB_MODE_INFO *best_mbmode, struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE],
    int best_rate_y, int best_rate_uv, int *best_skip2, int winner_mode_count) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  TxfmSearchParams *txfm_params = &x->txfm_search_params;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int64_t best_rd;
  const int num_planes = av1_num_planes(cm);

  if (!is_winner_mode_processing_enabled(cpi, x, best_mbmode,
                                         rd_cost->skip_txfm))
    return;

  // Set params for winner mode evaluation
  set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);

  // No best mode identified so far
  if (*best_mode_index == THR_INVALID) return;

  best_rd = RDCOST(x->rdmult, rd_cost->rate, rd_cost->dist);
  for (int mode_idx = 0; mode_idx < winner_mode_count; mode_idx++) {
    RD_STATS *winner_rd_stats = NULL;
    int winner_rate_y = 0, winner_rate_uv = 0;
    THR_MODES winner_mode_index = 0;

    // TODO(any): Combine best mode and multi-winner mode processing paths
    // Get winner mode stats for current mode index
    MB_MODE_INFO *winner_mbmi = get_winner_mode_stats(
        x, best_mbmode, rd_cost, best_rate_y, best_rate_uv, best_mode_index,
        &winner_rd_stats, &winner_rate_y, &winner_rate_uv, &winner_mode_index,
        cpi->sf.winner_mode_sf.multi_winner_mode_type, mode_idx);

    if (xd->lossless[winner_mbmi->segment_id] == 0 &&
        winner_mode_index != THR_INVALID &&
        is_winner_mode_processing_enabled(cpi, x, winner_mbmi,
                                          rd_cost->skip_txfm)) {
      RD_STATS rd_stats = *winner_rd_stats;
      int skip_blk = 0;
      RD_STATS rd_stats_y, rd_stats_uv;
      const int skip_ctx = av1_get_skip_txfm_context(xd);

      *mbmi = *winner_mbmi;

      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);

      // Select prediction reference frames.
      for (int i = 0; i < num_planes; i++) {
        xd->plane[i].pre[0] = yv12_mb[mbmi->ref_frame[0]][i];
        if (has_second_ref(mbmi))
          xd->plane[i].pre[1] = yv12_mb[mbmi->ref_frame[1]][i];
      }

      if (is_inter_mode(mbmi->mode)) {
        const int mi_row = xd->mi_row;
        const int mi_col = xd->mi_col;
        bool is_predictor_built = false;
        const PREDICTION_MODE prediction_mode = mbmi->mode;
        // Do interpolation filter search for realtime mode if applicable.
        if (cpi->sf.winner_mode_sf.winner_mode_ifs &&
            cpi->oxcf.mode == REALTIME &&
            cm->current_frame.reference_mode == SINGLE_REFERENCE &&
            is_inter_mode(prediction_mode) &&
            mbmi->motion_mode == SIMPLE_TRANSLATION &&
            !is_inter_compound_mode(prediction_mode)) {
          is_predictor_built =
              fast_interp_search(cpi, x, mi_row, mi_col, bsize);
        }
        if (!is_predictor_built) {
          av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                        av1_num_planes(cm) - 1);
        }
        if (mbmi->motion_mode == OBMC_CAUSAL)
          av1_build_obmc_inter_predictors_sb(cm, xd);

        av1_subtract_plane(x, bsize, 0);
        if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
            !xd->lossless[mbmi->segment_id]) {
          av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize,
                                              INT64_MAX);
          assert(rd_stats_y.rate != INT_MAX);
        } else {
          av1_pick_uniform_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize,
                                            INT64_MAX);
          memset(mbmi->inter_tx_size, mbmi->tx_size,
                 sizeof(mbmi->inter_tx_size));
          for (int i = 0; i < xd->height * xd->width; ++i)
            set_blk_skip(txfm_info->blk_skip, 0, i, rd_stats_y.skip_txfm);
        }
      } else {
        av1_pick_uniform_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize,
                                          INT64_MAX);
      }

      if (num_planes > 1) {
        av1_txfm_uvrd(cpi, x, &rd_stats_uv, bsize, INT64_MAX);
      } else {
        av1_init_rd_stats(&rd_stats_uv);
      }

      const ModeCosts *mode_costs = &x->mode_costs;
      if (is_inter_mode(mbmi->mode) &&
          RDCOST(x->rdmult,
                 mode_costs->skip_txfm_cost[skip_ctx][0] + rd_stats_y.rate +
                     rd_stats_uv.rate,
                 (rd_stats_y.dist + rd_stats_uv.dist)) >
              RDCOST(x->rdmult, mode_costs->skip_txfm_cost[skip_ctx][1],
                     (rd_stats_y.sse + rd_stats_uv.sse))) {
        skip_blk = 1;
        rd_stats_y.rate = mode_costs->skip_txfm_cost[skip_ctx][1];
        rd_stats_uv.rate = 0;
        rd_stats_y.dist = rd_stats_y.sse;
        rd_stats_uv.dist = rd_stats_uv.sse;
      } else {
        skip_blk = 0;
        rd_stats_y.rate += mode_costs->skip_txfm_cost[skip_ctx][0];
      }
      int this_rate = rd_stats.rate + rd_stats_y.rate + rd_stats_uv.rate -
                      winner_rate_y - winner_rate_uv;
      int64_t this_rd =
          RDCOST(x->rdmult, this_rate, (rd_stats_y.dist + rd_stats_uv.dist));
      if (best_rd > this_rd) {
        *best_mbmode = *mbmi;
        *best_mode_index = winner_mode_index;
        av1_copy_array(ctx->blk_skip, txfm_info->blk_skip, ctx->num_4x4_blk);
        av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
        rd_cost->rate = this_rate;
        rd_cost->dist = rd_stats_y.dist + rd_stats_uv.dist;
        rd_cost->sse = rd_stats_y.sse + rd_stats_uv.sse;
        rd_cost->rdcost = this_rd;
        best_rd = this_rd;
        *best_skip2 = skip_blk;
      }
    }
  }
}